

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshExporter.cpp
# Opt level: O2

void chrono::fea::ChMeshExporter::writeFrame
               (shared_ptr<chrono::fea::ChMesh> *my_mesh,char *SaveAsBuffer,string *MeshFileBuffer)

{
  pointer ppCVar1;
  double dVar2;
  ChLoadableU CVar3;
  ChLoadableUVW CVar4;
  element_type *peVar5;
  element_type *peVar6;
  uint uVar7;
  ostream *poVar8;
  uint i;
  uint uVar9;
  int iVar10;
  uint iele;
  double dVar11;
  shared_ptr<chrono::fea::ChElementShellANCF_3423> elementS;
  ChSystem *local_548;
  double scalar;
  undefined1 local_508 [32];
  shared_ptr<chrono::fea::ChElementCableANCF> elementC;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0 [5];
  shared_ptr<chrono::fea::ChElementShellANCF_3423> elementS_1;
  shared_ptr<chrono::fea::ChElementCableANCF> elementC_1;
  string SaveAsBuffer_string;
  ofstream output;
  ifstream CopyFrom;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  streambuf local_228 [504];
  
  std::ofstream::ofstream(&output);
  std::__cxx11::string::string((string *)&SaveAsBuffer_string,SaveAsBuffer,(allocator *)&CopyFrom);
  std::__cxx11::string::erase((ulong)&SaveAsBuffer_string,SaveAsBuffer_string._M_string_length - 4);
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)&SaveAsBuffer_string);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&CopyFrom,
                 &SaveAsBuffer_string,".vtk");
  snprintf(SaveAsBuffer,0x100,"%s");
  std::__cxx11::string::~string((string *)&CopyFrom);
  std::ofstream::open((char *)&output,(_Ios_Openmode)SaveAsBuffer);
  poVar8 = std::operator<<((ostream *)&output,"# vtk DataFile Version 2.0");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&output,"Unstructured Grid Example");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&output,"ASCII");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&output,"DATASET UNSTRUCTURED_GRID");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&output,"POINTS ");
  (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::operator<<(poVar8," float\n");
  uVar9 = 0;
  while( true ) {
    uVar7 = (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
    if (uVar7 <= uVar9) break;
    peVar5 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar5->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
              (&elementC,peVar5,(ulong)uVar9);
    std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::ChNodeBase>
              ((shared_ptr<chrono::ChNodeBase> *)&CopyFrom);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    poVar8 = std::ostream::_M_insert<double>(*(double *)(_CopyFrom + 0x20));
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>(*(double *)(_CopyFrom + 0x28));
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>(*(double *)(_CopyFrom + 0x30));
    std::operator<<(poVar8,"\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230);
    uVar9 = uVar9 + 1;
  }
  std::ifstream::ifstream(&CopyFrom,(string *)MeshFileBuffer,_S_in);
  std::ostream::operator<<(&output,local_228);
  iVar10 = 0;
  for (uVar9 = 0;
      peVar5 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      , uVar9 < (uint)((ulong)((long)(peVar5->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar5->velements).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uVar9 = uVar9 + 1) {
    ChMesh::GetElement((ChMesh *)&elementS,(uint)peVar5);
    std::dynamic_pointer_cast<chrono::fea::ChElementCableANCF,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&elementC);
    peVar6 = elementC.
             super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementS.
                super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar7 = 1;
    if (peVar6 == (element_type *)0x0) {
      ChMesh::GetElement((ChMesh *)&elementS,
                         (uint)(my_mesh->
                               super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      std::dynamic_pointer_cast<chrono::fea::ChElementShellANCF_3423,chrono::fea::ChElementBase>
                ((shared_ptr<chrono::fea::ChElementBase> *)&elementC);
      uVar7 = (uint)(elementC.
                     super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr != (element_type *)0x0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&elementC.
                  super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&elementS.
                  super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    iVar10 = iVar10 + uVar7;
  }
  poVar8 = std::operator<<((ostream *)&output,"\nCELL_DATA ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
  std::operator<<(poVar8,"\n");
  std::operator<<((ostream *)&output,"SCALARS Deflection float 1\n");
  std::operator<<((ostream *)&output,"LOOKUP_TABLE default\n");
  scalar = 0.0;
  for (uVar9 = 0;
      peVar5 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      , uVar9 < (uint)((ulong)((long)(peVar5->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar5->velements).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uVar9 = uVar9 + 1) {
    ChMesh::GetElement((ChMesh *)&elementS,(uint)peVar5);
    std::dynamic_pointer_cast<chrono::fea::ChElementCableANCF,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&elementC);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementS.
                super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if (elementC.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      ChMesh::GetElement((ChMesh *)local_508,
                         (uint)(my_mesh->
                               super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      std::dynamic_pointer_cast<chrono::fea::ChElementShellANCF_3423,chrono::fea::ChElementBase>
                ((shared_ptr<chrono::fea::ChElementBase> *)&elementS);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8));
      if (elementS.
          super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        ChElementShellANCF_3423::EvaluateDeflection
                  (elementS.
                   super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,&scalar);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&elementS.
                  super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      dVar11 = ChElementCableANCF::GetCurrLength
                         (elementC.
                          super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      scalar = dVar11 - ((elementC.
                          super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChElementBeam).length;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    poVar8 = std::ostream::_M_insert<double>(scalar + 1e-20);
    std::operator<<(poVar8,"\n");
  }
  std::operator<<((ostream *)&output,"VECTORS Strain float\n");
  local_548 = (ChSystem *)0x0;
  elementS.super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  elementS.super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (uVar9 = 0;
      peVar5 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      , uVar9 < (uint)((ulong)((long)(peVar5->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar5->velements).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uVar9 = uVar9 + 1) {
    ChMesh::GetElement((ChMesh *)&elementC,(uint)peVar5);
    std::dynamic_pointer_cast<chrono::fea::ChElementCableANCF,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&elementC_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (elementC_1.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      ChMesh::GetElement((ChMesh *)&elementC,
                         (uint)(my_mesh->
                               super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      std::dynamic_pointer_cast<chrono::fea::ChElementShellANCF_3423,chrono::fea::ChElementBase>
                ((shared_ptr<chrono::fea::ChElementBase> *)&elementS_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&elementC.
                  super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (elementS_1.
          super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        local_508._16_8_ = (pointer)0x0;
        local_508._0_8_ = (pointer)0x0;
        local_508._8_8_ = (pointer)0x0;
        ChElementShellANCF_3423::EvaluateSectionStrainStress
                  ((ChStrainStress3D *)&elementC,
                   elementS_1.
                   super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ChVector<double> *)local_508,0);
        elementS.
        super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)
               elementC.
               super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
        elementS.
        super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount = elementC.
                      super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount;
        local_548 = (ChSystem *)local_4d0[0]._0_8_;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&elementS_1.
                  super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      (*((elementC_1.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x19])
                (0,elementC_1.
                   super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&elementS);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementC_1.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    elementS.super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ((double)elementS.
                      super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1e-20);
    elementS.super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (elementS.
          super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1e-20);
    local_548 = (ChSystem *)((double)local_548 + 1e-20);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)elementS.
                                super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>
                       ((double)elementS.
                                super___shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>((double)local_548);
    std::operator<<(poVar8,"\n");
  }
  poVar8 = std::operator<<((ostream *)&output,"\nPOINT_DATA ");
  (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::operator<<(poVar8,"\n");
  std::operator<<((ostream *)&output,"VECTORS Velocity float\n");
  uVar9 = 0;
  while( true ) {
    uVar7 = (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
    if (uVar7 <= uVar9) break;
    peVar5 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar5->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
              (local_508,peVar5,(ulong)uVar9);
    std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::ChNodeBase>
              ((shared_ptr<chrono::ChNodeBase> *)&elementC);
    ppCVar1 = ((elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    dVar11 = ((elementC.
               super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ChElementBeam).mass;
    dVar2 = ((elementC.
              super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->super_ChElementBeam).length;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8));
    poVar8 = std::ostream::_M_insert<double>((double)ppCVar1 + 1e-20);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>(dVar11 + 1e-20);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>(dVar2 + 1e-20);
    std::operator<<(poVar8,"\n");
    uVar9 = uVar9 + 1;
  }
  std::operator<<((ostream *)&output,"VECTORS Acceleration float\n");
  uVar9 = 0;
  while( true ) {
    uVar7 = (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
    if (uVar7 <= uVar9) break;
    peVar5 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar5->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
              (local_508,peVar5,(ulong)uVar9);
    std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::ChNodeBase>
              ((shared_ptr<chrono::ChNodeBase> *)&elementC);
    CVar3 = (elementC.
             super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_ChLoadableU;
    CVar4 = (elementC.
             super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_ChLoadableUVW;
    dVar11 = *(double *)
              &(elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_use_damping;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementC.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8));
    poVar8 = std::ostream::_M_insert<double>((double)CVar3 + 1e-20);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>((double)CVar4 + 1e-20);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>(dVar11 + 1e-20);
    std::operator<<(poVar8,"\n");
    uVar9 = uVar9 + 1;
  }
  std::ofstream::close();
  std::ifstream::~ifstream(&CopyFrom);
  std::__cxx11::string::~string((string *)&SaveAsBuffer_string);
  std::ofstream::~ofstream(&output);
  return;
}

Assistant:

void ChMeshExporter::writeFrame(std::shared_ptr<ChMesh> my_mesh, char SaveAsBuffer[256], std::string MeshFileBuffer) {
    std::ofstream output;
    std::string SaveAsBuffer_string(SaveAsBuffer);
    SaveAsBuffer_string.erase(SaveAsBuffer_string.length() - 4, 4);
    std::cout << SaveAsBuffer_string << std::endl;
    snprintf(SaveAsBuffer, sizeof(char) * 256, ("%s"), (SaveAsBuffer_string + ".vtk").c_str());
    output.open(SaveAsBuffer, std::ios::trunc);

    output << "# vtk DataFile Version 2.0" << std::endl;
    output << "Unstructured Grid Example" << std::endl;
    output << "ASCII" << std::endl;
    output << "DATASET UNSTRUCTURED_GRID" << std::endl;

    output << "POINTS " << my_mesh->GetNnodes() << " float\n";
    for (unsigned int i = 0; i < my_mesh->GetNnodes(); i++) {
        auto node = std::dynamic_pointer_cast<ChNodeFEAxyz>(my_mesh->GetNode(i));
        output << node->GetPos().x() << " " << node->GetPos().y() << " " << node->GetPos().z() << "\n";
    }

    std::ifstream CopyFrom(MeshFileBuffer);
    output << CopyFrom.rdbuf();

    int numCell = 0;
    for (unsigned int iele = 0; iele < my_mesh->GetNelements(); iele++) {
        if (std::dynamic_pointer_cast<ChElementCableANCF>(my_mesh->GetElement(iele)))
            numCell++;
        else if (std::dynamic_pointer_cast<ChElementShellANCF_3423>(my_mesh->GetElement(iele)))
            numCell++;
    }

    output << "\nCELL_DATA " << numCell << "\n";
    output << "SCALARS Deflection float 1\n";
    output << "LOOKUP_TABLE default\n";

    double scalar = 0;
    for (unsigned int iele = 0; iele < my_mesh->GetNelements(); iele++) {
        if (auto elementC = std::dynamic_pointer_cast<ChElementCableANCF>(my_mesh->GetElement(iele)))
            scalar = elementC->GetCurrLength() - elementC->GetRestLength();
        else if (auto elementS = std::dynamic_pointer_cast<ChElementShellANCF_3423>(my_mesh->GetElement(iele)))
            elementS->EvaluateDeflection(scalar);
        output << scalar + 1e-20 << "\n";
    }

    output << "VECTORS Strain float\n";
    ChVector<> StrainV;
    for (unsigned int iele = 0; iele < my_mesh->GetNelements(); iele++) {
        if (auto elementC = std::dynamic_pointer_cast<ChElementCableANCF>(my_mesh->GetElement(iele)))
            elementC->EvaluateSectionStrain(0.0, StrainV);
        else if (auto elementS = std::dynamic_pointer_cast<ChElementShellANCF_3423>(my_mesh->GetElement(iele))) {
            const ChStrainStress3D strainStressOut =
                elementS->EvaluateSectionStrainStress(ChVector<double>(0, 0, 0), 0);
            StrainV.Set(strainStressOut.strain[0], strainStressOut.strain[1], strainStressOut.strain[3]);
        }
        StrainV += ChVector<>(1e-20);
        output << StrainV.x() << " " << StrainV.y() << " " << StrainV.z() << "\n";
    }

    output << "\nPOINT_DATA " << my_mesh->GetNnodes() << "\n";

    output << "VECTORS Velocity float\n";
    for (unsigned int i = 0; i < my_mesh->GetNnodes(); i++) {
        ChVector<> vel = std::dynamic_pointer_cast<ChNodeFEAxyz>(my_mesh->GetNode(i))->GetPos_dt();
        vel += ChVector<>(1e-20);
        output << (double)vel.x() << " " << (double)vel.y() << " " << (double)vel.z() << "\n";
    }

    output << "VECTORS Acceleration float\n";

    for (unsigned int i = 0; i < my_mesh->GetNnodes(); i++) {
        ChVector<> acc = std::dynamic_pointer_cast<ChNodeFEAxyz>(my_mesh->GetNode(i))->GetPos_dtdt();
        acc += ChVector<>(1e-20);
        output << (double)acc.x() << " " << (double)acc.y() << " " << (double)acc.z() << "\n";
    }

    output.close();
}